

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::processCommunications(FederateState *this,milliseconds period)

{
  strong_ordering sVar1;
  bool bVar2;
  size_t sVar3;
  type __rhs;
  type __lhs;
  long in_RDI;
  time_point ctime;
  MessageProcessingResult ret;
  time_point starttime;
  ActionMessage treq;
  ActionMessage *in_stack_fffffffffffffe58;
  type in_stack_fffffffffffffe60;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffe78;
  ActionMessage *in_stack_fffffffffffffe80;
  undefined6 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8e;
  MessageProcessingResult in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  duration<long,std::ratio<1l,1000l>> local_158 [8];
  rep local_150;
  rep local_148;
  __unspec local_13d;
  int local_13c;
  duration<long,std::ratio<1l,1000l>> local_138 [8];
  rep local_130;
  rep local_128;
  type local_119;
  undefined8 local_118;
  __unspec local_10d;
  int local_10c;
  duration<long,std::ratio<1l,1000l>> local_108 [15];
  type local_f9;
  undefined4 local_f8;
  MessageProcessingResult local_f1;
  undefined8 local_f0;
  native_handle_type local_d8;
  BaseType local_cc;
  undefined4 local_c4;
  BaseType local_c0;
  FederateState *in_stack_ffffffffffffffe8;
  milliseconds period_00;
  
  period_00.__r = in_RDI;
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffe80,(action_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  local_cc = (BaseType)
             std::atomic<helics::GlobalFederateId>::load
                       ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),seq_cst);
  local_c0 = local_cc;
  local_d8 = (native_handle_type)std::this_thread::get_id();
  sVar3 = std::hash<std::thread::id>::operator()
                    ((hash<std::thread::id> *)in_stack_fffffffffffffe60.__r,
                     (id *)in_stack_fffffffffffffe58);
  local_c4 = (undefined4)sVar3;
  addAction((FederateState *)in_stack_fffffffffffffe60.__r,in_stack_fffffffffffffe58);
  local_f0 = std::chrono::_V2::steady_clock::now();
  local_f1 = CONTINUE_PROCESSING;
  do {
    if (local_f1 == USER_RETURN) {
      local_10c = 10;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_108,&local_10c);
      sVar1 = std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                        ((duration<long,_std::ratio<1L,_1000L>_> *)
                         CONCAT17(in_stack_fffffffffffffe8f,
                                  CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
                         (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe80);
      local_f9 = sVar1._M_value;
      CLI::std::__cmp_cat::__unspec::__unspec(&local_10d,(__unspec *)0x0);
      bVar2 = std::operator>=(local_f9);
      if (bVar2) {
        local_118 = std::chrono::_V2::steady_clock::now();
        __rhs = std::chrono::operator-(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60.__r);
        local_130 = __rhs.__r;
        __lhs = std::chrono::operator-
                          (in_stack_fffffffffffffe78,
                           (duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        local_13c = 10;
        local_128 = __lhs.__r;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_138,&local_13c);
        sVar1 = std::chrono::
                operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffffe8f,
                                    CONCAT16(sVar1._M_value,in_stack_fffffffffffffe88)),
                           (duration<long,_std::ratio<1L,_1000L>_> *)__rhs.__r);
        local_119 = sVar1._M_value;
        CLI::std::__cmp_cat::__unspec::__unspec(&local_13d,(__unspec *)0x0);
        bVar2 = std::operator>(local_119);
        if (bVar2) {
          local_150 = (rep)std::chrono::operator-
                                     (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60.__r);
          in_stack_fffffffffffffe60 =
               std::chrono::operator-
                         (__lhs.__r,
                          (duration<long,_std::ratio<1L,_1000000000L>_> *)
                          CONCAT17(sVar1._M_value,in_stack_fffffffffffffe70));
          local_148 = in_stack_fffffffffffffe60.__r;
          std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    (local_158,(int *)&stack0xfffffffffffffea4);
          processCommunications(in_stack_ffffffffffffffe8,period_00);
        }
      }
      local_f8 = 0;
      goto LAB_004c43b4;
    }
    in_stack_fffffffffffffe8f =
         genericUnspecifiedQueueProcess
                   ((FederateState *)
                    CONCAT17(in_stack_fffffffffffffe8f,
                             CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
                    SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
    local_f1 = in_stack_fffffffffffffe8f;
  } while (in_stack_fffffffffffffe8f != BUSY);
  local_f8 = 1;
LAB_004c43b4:
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe60.__r);
  return;
}

Assistant:

void FederateState::processCommunications(std::chrono::milliseconds period)
{
    ActionMessage treq(CMD_USER_RETURN);
    treq.source_id = global_id.load();
    // the user return should only be for this thread, other threads will ignore it
    treq.messageID = static_cast<int32_t>(std::hash<std::thread::id>{}(std::this_thread::get_id()));
    addAction(treq);
    auto starttime = std::chrono::steady_clock::now();
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    while (ret != MessageProcessingResult::USER_RETURN) {
        ret = genericUnspecifiedQueueProcess(true);
        if (ret == MessageProcessingResult::BUSY) {
            return;
        }
    }
    if (period >= std::chrono::milliseconds(10)) {
        auto ctime = std::chrono::steady_clock::now();
        if (period - (ctime - starttime) > std::chrono::milliseconds(10)) {
            std::this_thread::sleep_for(period - (ctime - starttime));
            processCommunications(std::chrono::milliseconds(0));
        }
    }
}